

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O0

void Handlers::Trade_Remove(Character *character,PacketReader *reader)

{
  Character_Item CVar1;
  bool bVar2;
  unsigned_short uVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  list<Character_Item,_std::allocator<Character_Item>_> *this;
  reference pCVar7;
  short local_a0;
  int iStack_9c;
  Character_Item item_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2_1;
  Character_Item item;
  iterator __end2;
  iterator __begin2;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2;
  undefined1 local_50 [8];
  PacketBuilder builder;
  int itemid;
  PacketReader *reader_local;
  Character *character_local;
  
  if ((character->trading & 1U) != 0) {
    uVar3 = PacketReader::GetShort(reader);
    builder.add_size._4_4_ = (uint)uVar3;
    sVar5 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                      (&character->trade_inventory);
    if ((sVar5 < 6) &&
       (bVar2 = Character::DelTradeItem(character,(short)builder.add_size._4_4_), bVar2)) {
      character->trade_agree = false;
      character->trade_partner->trade_agree = false;
      sVar5 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                        (&character->trade_inventory);
      sVar6 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                        (&character->trade_partner->trade_inventory);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_50,PACKET_TRADE,PACKET_REPLY,sVar6 * 6 + 6 + sVar5 * 6);
      iVar4 = Character::PlayerID(character);
      PacketBuilder::AddShort((PacketBuilder *)local_50,iVar4);
      __end2 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                         (&character->trade_inventory);
      item = (Character_Item)
             std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                       (&character->trade_inventory);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&item), bVar2) {
        pCVar7 = std::_List_iterator<Character_Item>::operator*(&__end2);
        CVar1 = *pCVar7;
        __range2_1._0_2_ = CVar1.id;
        PacketBuilder::AddShort((PacketBuilder *)local_50,(int)(short)__range2_1);
        __range2_1._4_4_ = CVar1.amount;
        PacketBuilder::AddInt((PacketBuilder *)local_50,__range2_1._4_4_);
        std::_List_iterator<Character_Item>::operator++(&__end2);
      }
      PacketBuilder::AddByte((PacketBuilder *)local_50,0xff);
      iVar4 = Character::PlayerID(character->trade_partner);
      PacketBuilder::AddShort((PacketBuilder *)local_50,iVar4);
      this = &character->trade_partner->trade_inventory;
      __end2_1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(this);
      item_1 = (Character_Item)
               std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(this);
      while (bVar2 = std::operator!=(&__end2_1,(_Self *)&item_1), bVar2) {
        pCVar7 = std::_List_iterator<Character_Item>::operator*(&__end2_1);
        CVar1 = *pCVar7;
        local_a0 = CVar1.id;
        PacketBuilder::AddShort((PacketBuilder *)local_50,(int)local_a0);
        iStack_9c = CVar1.amount;
        PacketBuilder::AddInt((PacketBuilder *)local_50,iStack_9c);
        std::_List_iterator<Character_Item>::operator++(&__end2_1);
      }
      PacketBuilder::AddByte((PacketBuilder *)local_50,0xff);
      Character::Send(character,(PacketBuilder *)local_50);
      Character::Send(character->trade_partner,(PacketBuilder *)local_50);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
    }
  }
  return;
}

Assistant:

void Trade_Remove(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int itemid = reader.GetShort();

	if (character->trade_inventory.size() > 5)
	{
		return;
	}

	if (character->DelTradeItem(itemid))
	{
		character->trade_agree = false;
		character->trade_partner->trade_agree = false;

		PacketBuilder builder(PACKET_TRADE, PACKET_REPLY,
			6 + character->trade_inventory.size() * 6 + character->trade_partner->trade_inventory.size() * 6);

		builder.AddShort(character->PlayerID());
		UTIL_FOREACH(character->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		builder.AddShort(character->trade_partner->PlayerID());
		UTIL_FOREACH(character->trade_partner->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		character->Send(builder);
		character->trade_partner->Send(builder);
	}

}